

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O2

string * GetPathOrURLShortName(string *__return_storage_ptr__,string *strFullName)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (strFullName->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"/",&local_51);
    std::__cxx11::string::string((string *)&local_30,"\\",&local_52);
    string_replace(strFullName,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::rfind((char)strFullName,0x5c);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)strFullName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetPathOrURLShortName(std::string strFullName)
{
	if (strFullName.empty())
	{
		return "";
	}

	string_replace(strFullName, "/", "\\");

	std::string::size_type iPos = strFullName.find_last_of('\\') + 1;

	return strFullName.substr(iPos, strFullName.length() - iPos);
}